

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

void ngx_strlow(u_char *dst,u_char *src,size_t n)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  
  if (n != 0) {
    sVar2 = 0;
    do {
      bVar1 = src[sVar2];
      bVar3 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar3 = bVar1;
      }
      dst[sVar2] = bVar3;
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
  }
  return;
}

Assistant:

void
ngx_strlow(u_char *dst, u_char *src, size_t n)
{
    while (n) {
        *dst = ngx_tolower(*src);
        dst++;
        src++;
        n--;
    }
}